

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O2

UNormalizationCheckResult __thiscall
icu_63::ComposeNormalizer2::quickCheck
          (ComposeNormalizer2 *this,UnicodeString *s,UErrorCode *errorCode)

{
  short sVar1;
  char16_t *src;
  int iVar2;
  UNormalizationCheckResult UVar3;
  UNormalizationCheckResult qcResult;
  
  UVar3 = UNORM_MAYBE;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    src = UnicodeString::getBuffer(s);
    if (src == (char16_t *)0x0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      qcResult = UNORM_YES;
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      Normalizer2Impl::composeQuickCheck
                ((this->super_Normalizer2WithImpl).impl,src,src + iVar2,this->onlyContiguous,
                 &qcResult);
      UVar3 = qcResult;
    }
  }
  return UVar3;
}

Assistant:

virtual UNormalizationCheckResult
    quickCheck(const UnicodeString &s, UErrorCode &errorCode) const U_OVERRIDE {
        if(U_FAILURE(errorCode)) {
            return UNORM_MAYBE;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return UNORM_MAYBE;
        }
        UNormalizationCheckResult qcResult=UNORM_YES;
        impl.composeQuickCheck(sArray, sArray+s.length(), onlyContiguous, &qcResult);
        return qcResult;
    }